

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-util.cc
# Opt level: O2

void wabt::interp::WriteValues(Stream *stream,ValueTypes *types,Values *values)

{
  pointer pVVar1;
  pointer pVVar2;
  size_t i;
  ulong uVar3;
  long lVar4;
  TypedValue local_48;
  
  pVVar1 = (values->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (values->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if ((long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_start >> 2 == (long)pVVar2 - (long)pVVar1 >> 4) {
    lVar4 = 0;
    for (uVar3 = 0; uVar3 < (ulong)((long)pVVar2 - (long)pVVar1 >> 4); uVar3 = uVar3 + 1) {
      local_48.type.enum_ =
           (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar3].enum_;
      local_48.value.i64_ = *(u64 *)((long)pVVar1 + lVar4);
      local_48.value._8_8_ = ((u64 *)((long)pVVar1 + lVar4))[1];
      WriteValue(stream,&local_48);
      pVVar1 = (values->
               super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2 = (values->
               super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (uVar3 != ((long)pVVar2 - (long)pVVar1 >> 4) - 1U) {
        Stream::Writef(stream,", ");
        pVVar1 = (values->
                 super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar2 = (values->
                 super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      lVar4 = lVar4 + 0x10;
    }
    return;
  }
  __assert_fail("types.size() == values.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp-util.cc"
                ,0x59,"void wabt::interp::WriteValues(Stream *, const ValueTypes &, const Values &)"
               );
}

Assistant:

void WriteValues(Stream* stream,
                 const ValueTypes& types,
                 const Values& values) {
  assert(types.size() == values.size());
  for (size_t i = 0; i < values.size(); ++i) {
    WriteValue(stream, TypedValue{types[i], values[i]});
    if (i != values.size() - 1) {
      stream->Writef(", ");
    }
  }
}